

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

ns_connection * ns_connect(ns_mgr *mgr,char *address,ns_callback_t callback,void *user_data)

{
  int __fd;
  uint uVar1;
  int iVar2;
  ns_connection *pnVar3;
  int proto;
  int use_ssl;
  socket_address sa;
  char ca_cert [100];
  char cert [100];
  int local_120;
  int local_11c;
  socket_address local_118;
  char local_108 [112];
  char local_98 [104];
  
  ns_parse_address(address,&local_118,&local_120,&local_11c,local_98,local_108);
  __fd = socket(2,local_120,0);
  if (__fd == -1) {
    return (ns_connection *)0x0;
  }
  uVar1 = fcntl64(__fd,3,0);
  fcntl64(__fd,4,uVar1 | 0x800);
  if ((((local_120 == 2) || (iVar2 = connect(__fd,(sockaddr *)&local_118.sa,0x10), iVar2 == 0)) ||
      (iVar2 = ns_is_error(iVar2), iVar2 == 0)) &&
     (pnVar3 = ns_add_sock(mgr,__fd,callback,user_data), pnVar3 != (ns_connection *)0x0)) {
    *(undefined8 *)&pnVar3->sa = local_118._0_8_;
    *(uchar (*) [8])((long)&pnVar3->sa + 8) = local_118.sin.sin_zero;
    uVar1 = 8;
    if (local_120 == 2) {
      uVar1 = 0x100;
    }
    pnVar3->flags = uVar1;
    return pnVar3;
  }
  close(__fd);
  return (ns_connection *)0x0;
}

Assistant:

struct ns_connection *ns_connect(struct ns_mgr *mgr, const char *address,
                                 ns_callback_t callback, void *user_data) {
  sock_t sock = INVALID_SOCKET;
  struct ns_connection *nc = NULL;
  union socket_address sa;
  char cert[100], ca_cert[100];
  int rc, use_ssl, proto;

  ns_parse_address(address, &sa, &proto, &use_ssl, cert, ca_cert);
  if ((sock = socket(AF_INET, proto, 0)) == INVALID_SOCKET) {
    return NULL;
  }
  ns_set_non_blocking_mode(sock);
  rc = (proto == SOCK_DGRAM) ? 0 : connect(sock, &sa.sa, sizeof(sa.sin));

  if (rc != 0 && ns_is_error(rc)) {
    closesocket(sock);
    return NULL;
  } else if ((nc = ns_add_sock(mgr, sock, callback, user_data)) == NULL) {
    closesocket(sock);
    return NULL;
  }

  nc->sa = sa;   // Important, cause UDP conns will use sendto()
  nc->flags = (proto == SOCK_DGRAM) ? NSF_UDP : NSF_CONNECTING;

#ifdef NS_ENABLE_SSL
  if (use_ssl) {
    if ((nc->ssl_ctx = SSL_CTX_new(SSLv23_client_method())) == NULL ||
        ns_use_cert(nc->ssl_ctx, cert) != 0 ||
        ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0 ||
        (nc->ssl = SSL_new(nc->ssl_ctx)) == NULL) {
      ns_close_conn(nc);
      return NULL;
    } else {
      SSL_set_fd(nc->ssl, sock);
    }
  }
#endif

  return nc;
}